

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

void __thiscall ncnn::Convolution::Convolution(Convolution *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Convolution_001dbbe0;
  Mat::Mat((Mat *)(in_RDI + 0x1f));
  Mat::Mat((Mat *)(in_RDI + 0x27));
  Mat::Mat((Mat *)(in_RDI + 0x2f));
  Mat::Mat((Mat *)(in_RDI + 0x37));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

Convolution::Convolution()
{
    one_blob_only = true;
    support_inplace = false;

    use_int8_requantize = false;
}